

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  char **ppcVar1;
  FILE *__stream;
  _IO_FILE *p_Var2;
  char *pcVar3;
  char *pcVar4;
  
  (this->super_buffer<char>).size_ = 0;
  (this->super_buffer<char>).capacity_ = 0;
  (this->super_buffer<char>).grow_ = grow;
  (this->file_).super_file_base<_IO_FILE>.file_ = f;
  flockfile((FILE *)f);
  __stream = (FILE *)(this->file_).super_file_base<_IO_FILE>.file_;
  if (__stream->_IO_write_ptr == (char *)0x0) {
    putc_unlocked(0,__stream);
    ppcVar1 = &((this->file_).super_file_base<_IO_FILE>.file_)->_IO_write_ptr;
    *ppcVar1 = *ppcVar1 + -1;
  }
  p_Var2 = (this->file_).super_file_base<_IO_FILE>.file_;
  pcVar3 = p_Var2->_IO_write_ptr;
  pcVar4 = p_Var2->_IO_buf_end;
  (this->super_buffer<char>).ptr_ = pcVar3;
  (this->super_buffer<char>).capacity_ = (long)pcVar4 - (long)pcVar3;
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }